

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O1

void alloc_free(void *ptr)

{
  long in_FS_OFFSET;
  
  if (ptr == (void *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    free(ptr);
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void
alloc_free(void* ptr)
{
  if (ptr == NULL) {
#ifdef DEBUG
    /* catch NULL pointers passed to frees in debug mode */
    PANIC(__FUNCTION__, __FILE__, __LINE__);
#else
    /* if we are not in debug mode this case will be ignored for stability */
    return;
#endif /* DEBUG */
  }
  free(ptr);
}